

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O2

string * __thiscall util::Lexer::ReadOperator_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  char chars [3];
  undefined2 local_1c;
  undefined1 local_1a;
  allocator<char> local_19;
  
  local_1a = 0;
  local_1c = 0;
  GetChar(this,(char *)&local_1c);
  PeekChar(this,(char *)((long)&local_1c + 1));
  bVar1 = check_op((char)local_1c,local_1c._1_1_);
  if (bVar1) {
    GetChar(this,(char *)((long)&local_1c + 1));
  }
  else {
    local_1c = local_1c & 0xff;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&local_1c,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadOperator()
	{
		char chars[3]{};

		this->GetChar(chars[0]);
		this->PeekChar(chars[1]);

		if (check_op(chars[0], chars[1]))
			this->GetChar(chars[1]);
		else
			chars[1] = '\0';

		return chars;
	}